

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::usda::EnumHandler<tinyusdz::APISchemas::APIName>
            (expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *prop_name,string *tok,
            vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
            *enums)

{
  undefined8 this;
  bool bVar1;
  expected_lite *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  ParseState *value_00;
  allocator local_159;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  reference local_98;
  pair<tinyusdz::APISchemas::APIName,_const_char_*> *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
  *__range2;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_50 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
  *enums_local;
  string *tok_local;
  string *prop_name_local;
  
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = enums;
  CheckAllowedTokens<tinyusdz::APISchemas::APIName>
            ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,enums,tok);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_50);
  this = ret.contained.
         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._32_8_;
  if (bVar1) {
    __end0 = ::std::
             vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
             ::begin((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                      *)ret.contained.
                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_);
    item = (pair<tinyusdz::APISchemas::APIName,_const_char_*> *)
           ::std::
           vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
           ::end((vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                  *)this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<const_std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_*,_std::vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>_>
                                  *)&item);
      if (!bVar1) break;
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_*,_std::vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>_>
                 ::operator*(&__end0);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )tok,local_98->second);
      if (bVar1) {
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<tinyusdz::APISchemas::APIName,_0>(__return_storage_ptr__,&local_98->first);
        goto LAB_0018bc6c;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_*,_std::vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>_>
      ::operator++(&__end0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_158,"\"",&local_159);
    quote(&local_138,tok,&local_158);
    ::std::operator+(local_118,(char *)&local_138);
    ::std::operator+(local_f8,local_118);
    ::std::operator+(local_d8,(char *)local_f8);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              (&local_b8,(expected_lite *)local_d8,value_00);
    nonstd::expected_lite::
    expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_b8);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type(&local_b8);
    ::std::__cxx11::string::~string((string *)local_d8);
    ::std::__cxx11::string::~string((string *)local_f8);
    ::std::__cxx11::string::~string((string *)local_118);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
  }
  else {
    this_00 = (expected_lite *)
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_50);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string&>(&local_70,this_00,value);
    nonstd::expected_lite::
    expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_70);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type(&local_70);
  }
LAB_0018bc6c:
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<T, std::string> EnumHandler(
    const std::string &prop_name, const std::string &tok,
    const std::vector<std::pair<T, const char *>> &enums) {
  auto ret = CheckAllowedTokens<T>(enums, tok);
  if (!ret) {
    return nonstd::make_unexpected(ret.error());
  }

  for (auto &item : enums) {
    if (tok == item.second) {
      return item.first;
    }
  }
  // Should never reach here, though.
  return nonstd::make_unexpected(
      quote(tok) + " is an invalid token for attribute `" + prop_name + "`");
}